

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

undefined8 * __thiscall QWidgetPrivate::flagsForDumping_abi_cxx11_(QWidgetPrivate *this)

{
  bool bVar1;
  int iVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  ostream *this_00;
  ostream *poVar5;
  ostream *poVar6;
  QWidgetPrivate *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  string *flags;
  stringstream s;
  undefined8 in_stack_fffffffffffffdf8;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  QWidget *in_stack_fffffffffffffe10;
  stringstream local_190 [16];
  ostream aoStack_180 [376];
  long local_8;
  
  __c = (char)((ulong)in_stack_fffffffffffffdf8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RSI);
  *in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1] = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[2] = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[3] = &DAT_aaaaaaaaaaaaaaaa;
  QObjectPrivate::flagsForDumping_abi_cxx11_();
  pQVar4 = QApplication::focusWidget();
  if (pQVar4 == pQVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe00,__c);
  }
  bVar1 = QWidget::isVisible((QWidget *)0x382bcb);
  if (bVar1) {
    memset(local_190,0xaa,0x188);
    std::__cxx11::stringstream::stringstream(local_190);
    this_00 = std::operator<<(aoStack_180,'<');
    iVar2 = QWidget::width((QWidget *)0x382c13);
    poVar5 = (ostream *)std::ostream::operator<<(this_00,iVar2);
    poVar5 = std::operator<<(poVar5,'x');
    iVar2 = QWidget::height((QWidget *)0x382c3a);
    poVar6 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::showpos);
    iVar2 = QWidget::x(in_stack_fffffffffffffe10);
    pQVar3 = (QWidget *)std::ostream::operator<<(poVar6,iVar2);
    iVar2 = QWidget::y(pQVar3);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)pQVar3,iVar2);
    std::operator<<(poVar6,'>');
    std::__cxx11::stringstream::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)poVar5);
    std::__cxx11::stringstream::~stringstream(local_190);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffe00,__c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string QWidgetPrivate::flagsForDumping() const
{
    Q_Q(const QWidget);
    std::string flags = QObjectPrivate::flagsForDumping();
    if (QApplication::focusWidget() == q)
        flags += 'F';
    if (q->isVisible()) {
        std::stringstream s;
        s << '<'
          << q->width() << 'x' << q->height()
          << std::showpos << q->x() << q->y()
          << '>';
        flags += s.str();
    } else {
        flags += 'I';
    }
    return flags;
}